

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_array2d_utils.h
# Opt level: O3

Array2D<double> *
TNT::operator-(Array2D<double> *__return_storage_ptr__,Array2D<double> *A,Array2D<double> *B)

{
  uint m;
  uint n;
  double **ppdVar1;
  double **ppdVar2;
  double **ppdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  
  m = A->m_;
  if (B->m_ == m) {
    n = A->n_;
    if (B->n_ == n) {
      Array2D<double>::Array2D(__return_storage_ptr__,m,n);
      if ((int)m < 1) {
        return __return_storage_ptr__;
      }
      ppdVar1 = (A->v_).data_;
      ppdVar2 = (B->v_).data_;
      ppdVar3 = (__return_storage_ptr__->v_).data_;
      uVar7 = 0;
      do {
        if (0 < (int)n) {
          pdVar4 = ppdVar1[uVar7];
          pdVar5 = ppdVar2[uVar7];
          pdVar6 = ppdVar3[uVar7];
          uVar8 = 0;
          do {
            pdVar6[uVar8] = pdVar4[uVar8] - pdVar5[uVar8];
            uVar8 = uVar8 + 1;
          } while (n != uVar8);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != m);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->data_).v_.data_ = (double *)0x0;
  (__return_storage_ptr__->data_).v_.ref_count_ = (int *)0x0;
  (__return_storage_ptr__->data_).n_ = 0;
  (__return_storage_ptr__->data_).data_ = (double *)0x0;
  (__return_storage_ptr__->v_).v_.data_ = (double **)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->v_).v_.data_ + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->v_).v_.ref_count_ + 4) = 0;
  (__return_storage_ptr__->v_).data_ = (double **)0x0;
  __return_storage_ptr__->m_ = 0;
  __return_storage_ptr__->n_ = 0;
  return __return_storage_ptr__;
}

Assistant:

Array2D<T> operator-(const Array2D<T> &A, const Array2D<T> &B)
{
	int m = A.dim1();
	int n = A.dim2();

	if (B.dim1() != m ||  B.dim2() != n )
		return Array2D<T>();

	else
	{
		Array2D<T> C(m,n);

		for (int i=0; i<m; i++)
		{
			for (int j=0; j<n; j++)
				C[i][j] = A[i][j] - B[i][j];
		}
		return C;
	}
}